

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O3

PolyNf * __thiscall
Inferences::simplifyPoly<Kernel::NumTraits<Kernel::RationalConstantType>>
          (PolyNf *__return_storage_ptr__,Inferences *this,
          Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in,PolyNf *simplifiedArgs,
          bool removeZeros)

{
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  mp_limb_t mVar2;
  mp_limb_t mVar3;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar9;
  IntegerConstantType *pIVar10;
  char *pcVar11;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> fac;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> simpl;
  Monom monom;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_1b8;
  uint local_194;
  ulong local_190;
  PolyNf *local_188;
  ulong local_180;
  long local_178;
  ulong local_170;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_168;
  __mpz_struct local_160;
  __mpz_struct local_150;
  uint local_140;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_138;
  __mpz_struct local_130;
  __mpz_struct local_120;
  uint local_110;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_108;
  RationalConstantType local_100;
  uint local_e0;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_d8;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_d0;
  __mpz_struct local_a0;
  __mpz_struct local_90;
  int local_80;
  mp_limb_t *local_78;
  RationalConstantType local_70;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_50;
  
  local_50._stack._0_4_ = 0;
  local_50._stack._4_4_ = 0;
  local_50._cursor._0_4_ = 0;
  local_50._cursor._4_4_ = 0;
  local_1b8._cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_1b8._end = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_1b8._capacity = 0;
  local_1b8._stack = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  lVar6 = *(long *)(this + 8);
  pMVar9 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_194 = (uint)simplifiedArgs;
  uVar8 = local_194 & 0xff;
  local_168 = in;
  if ((int)((ulong)(*(long *)(this + 0x10) - lVar6) >> 4) * -0x55555555 == 0) {
    local_50._capacity = 0;
  }
  else {
    pcVar11 = (char *)0x0;
    local_188 = __return_storage_ptr__;
    do {
      pIVar10 = (IntegerConstantType *)((long)pcVar11 * 0x30 + lVar6);
      Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_a0,pIVar10);
      Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_90,pIVar10 + 1)
      ;
      local_80 = pIVar10[2]._val[0]._mp_alloc;
      local_78 = pIVar10[2]._val[0]._mp_d;
      simplifyMonom<Kernel::NumTraits<Kernel::RationalConstantType>>
                (&local_d0,(Inferences *)&local_a0,
                 (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                 (&(local_168->_summands)._capacity + (long)(int)pMVar9 * 3),(PolyNf *)(ulong)uVar8,
                 removeZeros);
      bVar5 = Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::isZeroMul(&local_d0);
      if (((byte)local_194 & bVar5) == 0) {
        pMVar1 = ((local_d0.factors._ptr)->_factors)._stack;
        if (((((int)((ulong)((long)((local_d0.factors._ptr)->_factors)._cursor - (long)pMVar1) >> 2)
               * -0x49249249 == 1) && (pMVar1->power == 1)) &&
            ((undefined1  [24])
             ((undefined1  [24])
              (pMVar1->term).super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             & (undefined1  [24])0x3) == (undefined1  [24])0x2)) &&
           (((pMVar1->term).super_PolyNfSuper._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
             .
             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             ._content[0] & 3U) == 1)) {
          local_178 = *(long *)((pMVar1->term).super_PolyNfSuper._inner.
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                .
                                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                ._content + 9);
          pIVar10 = *(IntegerConstantType **)(local_178 + 8);
          lVar6 = (long)*(IntegerConstantType **)(local_178 + 0x10) - (long)pIVar10;
          if (pIVar10 != (IntegerConstantType *)0x0 && lVar6 != 0) {
            local_180 = (lVar6 >> 4) * -0x5555555555555555;
            uVar7 = (ulong)(*(IntegerConstantType **)(local_178 + 0x10) != pIVar10);
            local_190 = uVar7 - 1;
            do {
              local_170 = uVar7;
              Kernel::IntegerConstantType::IntegerConstantType(&local_100._num,pIVar10);
              Kernel::IntegerConstantType::IntegerConstantType(&local_100._den,pIVar10 + 1);
              local_e0 = pIVar10[2]._val[0]._mp_alloc;
              local_d8 = (MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                         pIVar10[2]._val[0]._mp_d;
              Kernel::RationalConstantType::operator*(&local_70,&local_100,&local_d0.numeral);
              mpz_swap((__mpz_struct *)&local_100,(__mpz_struct *)&local_70);
              mpz_swap(local_100._den._val,local_70._den._val);
              mpz_clear(local_70._den._val);
              mpz_clear((__mpz_struct *)&local_70);
              Kernel::IntegerConstantType::IntegerConstantType
                        ((IntegerConstantType *)&local_130,&local_100._num);
              Kernel::IntegerConstantType::IntegerConstantType
                        ((IntegerConstantType *)&local_120,&local_100._den);
              local_110 = local_e0;
              local_108 = local_d8;
              if (local_1b8._cursor == local_1b8._end) {
                Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
                          (&local_1b8);
              }
              pMVar4 = local_1b8._cursor;
              Kernel::IntegerConstantType::IntegerConstantType
                        ((IntegerConstantType *)local_1b8._cursor,(IntegerConstantType *)&local_130)
              ;
              Kernel::IntegerConstantType::IntegerConstantType
                        (&(pMVar4->numeral)._den,(IntegerConstantType *)&local_120);
              (pMVar4->factors)._id = local_110;
              (pMVar4->factors)._ptr = local_108;
              local_1b8._cursor = local_1b8._cursor + 1;
              mpz_clear(&local_120);
              mpz_clear(&local_130);
              mpz_clear(local_100._den._val);
              mpz_clear((__mpz_struct *)&local_100);
              local_190 = local_190 + 1;
              if (local_180 <= local_190) break;
              uVar7 = local_170 + 1;
              pIVar10 = (IntegerConstantType *)(local_170 * 0x30 + *(long *)(local_178 + 8));
            } while (*(long *)(local_178 + 8) != 0);
          }
        }
        else {
          Kernel::IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)&local_160,(IntegerConstantType *)&local_d0);
          Kernel::IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)&local_150,&local_d0.numeral._den);
          local_140 = local_d0.factors._id;
          local_138 = local_d0.factors._ptr;
          if (local_1b8._cursor == local_1b8._end) {
            Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
                      (&local_1b8);
          }
          pMVar4 = local_1b8._cursor;
          Kernel::IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)local_1b8._cursor,(IntegerConstantType *)&local_160);
          Kernel::IntegerConstantType::IntegerConstantType
                    (&(pMVar4->numeral)._den,(IntegerConstantType *)&local_150);
          (pMVar4->factors)._id = local_140;
          (pMVar4->factors)._ptr = local_138;
          local_1b8._cursor = local_1b8._cursor + 1;
          mpz_clear(&local_150);
          mpz_clear(&local_160);
        }
      }
      mVar2 = local_78[2];
      mVar3 = local_78[1];
      mpz_clear(local_d0.numeral._den._val);
      mpz_clear((__mpz_struct *)&local_d0);
      mpz_clear(&local_90);
      mpz_clear(&local_a0);
      pMVar9 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               (ulong)(uint)((int)pMVar9 + (int)(mVar2 - mVar3 >> 2) * -0x49249249);
      pcVar11 = pcVar11 + 1;
      lVar6 = *(long *)(this + 8);
      simplifiedArgs =
           (PolyNf *)
           (ulong)(uint)((int)((ulong)(*(long *)(this + 0x10) - lVar6) >> 4) * -0x55555555);
    } while (pcVar11 < simplifiedArgs);
    local_50._capacity = local_1b8._capacity;
    __return_storage_ptr__ = local_188;
    pMVar9 = local_1b8._end;
    local_50._stack._0_4_ = local_1b8._stack._0_4_;
    local_50._stack._4_4_ = local_1b8._stack._4_4_;
    local_50._cursor._0_4_ = local_1b8._cursor._0_4_;
    local_50._cursor._4_4_ = local_1b8._cursor._4_4_;
  }
  local_1b8._capacity = 0;
  local_1b8._stack = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_1b8._cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_1b8._end = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_50._end = pMVar9;
  PolynomialEvaluation::simplifySummation<Kernel::NumTraits<Kernel::RationalConstantType>>
            (__return_storage_ptr__,(PolynomialEvaluation *)&local_50,
             (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)(ulong)uVar8
             ,SUB81(simplifiedArgs,0));
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack(&local_50);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack(&local_1b8);
  return __return_storage_ptr__;
}

Assistant:

PolyNf simplifyPoly(Polynom<Number> const& in, PolyNf* simplifiedArgs, bool removeZeros)
{
  using Monom   = Monom<Number>;


  // first we simplify all the monoms containted in this polynom
  Stack<Monom> sum;
  {
    auto offs = 0;
    for (unsigned i = 0; i < in.nSummands(); i++) {
      auto monom  = in.summandAt(i);
      auto simpl = simplifyMonom(monom, &simplifiedArgs[offs], removeZeros);

      if (simpl.isZeroMul() && removeZeros) {
        /* we don't add it */
      } else if (simpl.factors->nFactors() == 1 && simpl.factors->factorAt(0).tryPolynom().isSome()) {
        /* k * (t1 + ... tn) ==> k * t1 + ... k * tn */
        auto poly = simpl.factors->factorAt(0).tryPolynom().unwrap();
        for (auto fac : poly->iterSummands()) {
          fac.numeral = fac.numeral * simpl.numeral;
          ASS(!removeZeros || fac.numeral != Number::constant(0))
          sum.push(fac);
        }
      } else {
        sum.push(simpl);
      }
      offs += monom.factors->nFactors();
    }
  }

  return PolynomialEvaluation::simplifySummation(std::move(sum), removeZeros);
}